

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O2

size_t __thiscall caffe::ELUParameter::ByteSizeLong(ELUParameter *this)

{
  UnknownFieldSet *unknown_fields;
  size_t sVar1;
  size_t sVar2;
  
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    sVar1 = 0;
  }
  else {
    unknown_fields = ELUParameter::unknown_fields(this);
    sVar1 = google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  }
  sVar2 = sVar1 + 5;
  if (((this->_has_bits_).has_bits_[0] & 1) == 0) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t ELUParameter::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:caffe.ELUParameter)
  size_t total_size = 0;

  if (_internal_metadata_.have_unknown_fields()) {
    total_size +=
      ::google::protobuf::internal::WireFormat::ComputeUnknownFieldsSize(
        unknown_fields());
  }
  // optional float alpha = 1 [default = 1];
  if (has_alpha()) {
    total_size += 1 + 4;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}